

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsATimes(void *ida_mem,N_Vector v,N_Vector z)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = idaLs_AccessLMem((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             (IDALsMem *)0x11b78e);
  if (local_4 == 0) {
    local_4 = (**(code **)(local_30 + 0x130))
                        (*(undefined8 *)(local_28 + 0x2a8),*(undefined8 *)(local_28 + 0x2b8),
                         *(undefined8 *)(local_30 + 0x48),*(undefined8 *)(local_30 + 0x50),
                         *(undefined8 *)(local_30 + 0x58),in_RSI,in_RDX,
                         *(undefined8 *)(local_30 + 0x140),*(undefined8 *)(local_30 + 0x30),
                         *(undefined8 *)(local_30 + 0x38));
    *(long *)(local_30 + 0xb8) = *(long *)(local_30 + 0xb8) + 1;
  }
  return local_4;
}

Assistant:

int idaLsATimes(void* ida_mem, N_Vector v, N_Vector z)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call Jacobian-times-vector product routine
     (either user-supplied or internal DQ) */
  retval = idals_mem->jtimes(IDA_mem->ida_tn, idals_mem->ycur, idals_mem->ypcur,
                             idals_mem->rcur, v, z, IDA_mem->ida_cj,
                             idals_mem->jt_data, idals_mem->ytemp,
                             idals_mem->yptemp);
  idals_mem->njtimes++;
  return (retval);
}